

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_details.hpp
# Opt level: O3

bool __thiscall
Infector::Container::resolve_multiple_inheritance_inner<IBedVS>(Container *this,type_index T)

{
  iterator iVar1;
  mapped_type *pmVar2;
  key_type local_28;
  
  local_28._M_target = (type_info *)&IBedVS::typeinfo;
  iVar1 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->typeMap)._M_h,&local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_28._M_target = (type_info *)&IBedVS::typeinfo;
    pmVar2 = std::__detail::
             _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->typeMap,&local_28);
    (pmVar2->type)._M_target = T._M_target;
    pmVar2->single = true;
  }
  return iVar1.
         super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
         ._M_cur == (__node_type *)0x0;
}

Assistant:

bool Container::resolve_multiple_inheritance_inner(std::type_index T){

        auto it = typeMap.find(   std::type_index(typeid(Contract)) );
        if( it!=typeMap.end())
            return false;

        typeMap[std::type_index(typeid(Contract))]
                = Binding(T, true);
        return true;
    }